

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::ReLU_x86_avx512::forward_inplace(ReLU_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  byte bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined8 uVar22;
  ushort uVar23;
  float *pfVar24;
  long *in_RSI;
  long *in_RDI;
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  __m128 _neg_1;
  __m128 _pos_1;
  __m128 _p_5;
  __m128 _slope;
  __m128 _zero_1;
  __m256 _neg;
  __m256 _pos;
  __m256 _p_4;
  __m256 _slope_avx;
  __m256 _zero_avx_1;
  __mmask16 _is_negative;
  __m512 _p_3;
  __m512 _slope_avx512;
  __m512 _zero_avx512_1;
  int i_1;
  float *ptr_1;
  int q_1;
  __m128 _p_2;
  __m128 _zero;
  __m256 _p_1;
  __m256 _zero_avx;
  __m512 _p;
  __m512 _zero_avx512;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  int elembits;
  Mat *m_1;
  Mat *m;
  int local_e24;
  undefined8 local_df0;
  undefined8 uStackY_de8;
  undefined8 local_d80;
  undefined8 uStackY_d78;
  undefined8 uStackY_d70;
  undefined8 uStackY_d68;
  Option *in_stack_fffffffffffff2b0;
  Mat *in_stack_fffffffffffff2b8;
  ReLU_x86_avx512 *in_stack_fffffffffffff2c0;
  int iStack_cf4;
  int iStack_cf0;
  int iStack_cec;
  int iStack_ce8;
  int iStack_ce4;
  int iStack_ce0;
  int iStack_cdc;
  int iStack_cd8;
  int iStack_cd4;
  int iStack_cd0;
  int iStack_ccc;
  int iStack_cc8;
  int iStack_cc4;
  int local_c3c;
  undefined1 (*local_bf0) [64];
  int local_be8;
  float local_be4;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 local_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 uStack_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 uStack_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  int local_ad8;
  undefined8 local_ac8;
  undefined8 local_ac0;
  undefined8 local_ab8;
  undefined4 local_ab0;
  long local_aa8;
  undefined4 local_aa0;
  undefined4 local_a9c;
  undefined4 local_a98;
  undefined4 local_a94;
  undefined4 local_a90;
  undefined8 local_a88;
  undefined1 (*local_a80) [64];
  int local_a78;
  int local_a74;
  int local_a70;
  int local_a6c;
  int local_a68;
  int local_a64;
  int local_a60;
  int local_a5c;
  long *local_a50;
  int local_a3c;
  undefined1 local_a15;
  int local_a14;
  undefined8 *local_a08;
  undefined8 *local_9f8;
  undefined8 *local_9e0;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 uStack_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined1 (*local_908) [64];
  undefined1 local_880 [64];
  undefined1 (*local_808) [64];
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 uStack_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 uStack_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined1 (*local_708) [64];
  undefined1 local_6c0 [32];
  undefined1 (*local_688) [64];
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined1 local_5e0 [16];
  undefined1 (*local_5c8) [64];
  undefined1 local_5a0 [16];
  undefined1 (*local_588) [64];
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  int local_400;
  int iStack_3fc;
  int iStack_3f8;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  float local_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  long local_260;
  undefined4 local_254;
  long local_250;
  undefined1 (*local_248) [64];
  undefined4 local_23c;
  int local_238;
  int local_234;
  undefined8 *local_230;
  undefined4 local_1dc;
  long local_1d8;
  undefined8 *local_198;
  
  if ((int)in_RSI[3] == 0) {
    local_e24 = 0;
  }
  else {
    local_e24 = (int)((long)((ulong)(uint)((int)(in_RSI[2] << 3) >> 0x1f) << 0x20 |
                            in_RSI[2] << 3 & 0xffffffffU) / (long)(int)in_RSI[3]);
  }
  local_a5c = local_e24;
  if (local_e24 == 8) {
    local_a3c = forward_inplace_int8
                          (in_stack_fffffffffffff2c0,in_stack_fffffffffffff2b8,
                           in_stack_fffffffffffff2b0);
  }
  else {
    local_a60 = *(int *)((long)in_RSI + 0x2c);
    local_a64 = (int)in_RSI[6];
    local_a68 = *(int *)((long)in_RSI + 0x34);
    local_a6c = (int)in_RSI[7];
    local_a70 = (int)in_RSI[3];
    local_a74 = local_a60 * local_a64 * local_a68 * local_a70;
    fVar1 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      for (local_be8 = 0; local_be8 < local_a6c; local_be8 = local_be8 + 1) {
        local_bf0 = (undefined1 (*) [64])(*in_RSI + in_RSI[8] * (long)local_be8 * in_RSI[2]);
        local_c3c = 0;
        auVar25 = vbroadcastss_avx512f
                            (ZEXT416(*(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0)));
        for (; local_c3c + 0xf < local_a74; local_c3c = local_c3c + 0x10) {
          iStack_cf4 = (int)((ulong)*(undefined8 *)(*local_bf0 + 8) >> 0x20);
          iStack_cf0 = (int)*(undefined8 *)(*local_bf0 + 0x10);
          iStack_cec = (int)((ulong)*(undefined8 *)(*local_bf0 + 0x10) >> 0x20);
          iStack_ce8 = (int)*(undefined8 *)(*local_bf0 + 0x18);
          iStack_ce4 = (int)((ulong)*(undefined8 *)(*local_bf0 + 0x18) >> 0x20);
          iStack_ce0 = (int)*(undefined8 *)(*local_bf0 + 0x20);
          iStack_cdc = (int)((ulong)*(undefined8 *)(*local_bf0 + 0x20) >> 0x20);
          iStack_cd8 = (int)*(undefined8 *)(*local_bf0 + 0x28);
          iStack_cd4 = (int)((ulong)*(undefined8 *)(*local_bf0 + 0x28) >> 0x20);
          iStack_cd0 = (int)*(undefined8 *)(*local_bf0 + 0x30);
          iStack_ccc = (int)((ulong)*(undefined8 *)(*local_bf0 + 0x30) >> 0x20);
          iStack_cc8 = (int)*(undefined8 *)(*local_bf0 + 0x38);
          iStack_cc4 = (int)((ulong)*(undefined8 *)(*local_bf0 + 0x38) >> 0x20);
          auVar26._12_4_ = iStack_cf4;
          auVar26._0_12_ = *(undefined1 (*) [12])*local_bf0;
          auVar26._16_4_ = iStack_cf0;
          auVar26._20_4_ = iStack_cec;
          auVar26._24_4_ = iStack_ce8;
          auVar26._28_4_ = iStack_ce4;
          auVar26._32_4_ = iStack_ce0;
          auVar26._36_4_ = iStack_cdc;
          auVar26._40_4_ = iStack_cd8;
          auVar26._44_4_ = iStack_cd4;
          auVar26._48_4_ = iStack_cd0;
          auVar26._52_4_ = iStack_ccc;
          auVar26._56_4_ = iStack_cc8;
          auVar26._60_4_ = iStack_cc4;
          uVar22 = vcmpps_avx512f(auVar26,ZEXT1664(ZEXT816(0)),1);
          uVar23 = (ushort)uVar22;
          local_400 = (int)*(undefined8 *)*local_bf0;
          iStack_3fc = (int)((ulong)*(undefined8 *)*local_bf0 >> 0x20);
          iStack_3f8 = (int)*(undefined8 *)(*local_bf0 + 8);
          auVar26 = vmulps_avx512f(*local_bf0,auVar25);
          bVar3 = (bool)((byte)uVar22 & 1);
          bVar4 = (bool)((byte)(uVar23 >> 1) & 1);
          bVar5 = (bool)((byte)(uVar23 >> 2) & 1);
          bVar6 = (bool)((byte)(uVar23 >> 3) & 1);
          bVar7 = (bool)((byte)(uVar23 >> 4) & 1);
          bVar8 = (bool)((byte)(uVar23 >> 5) & 1);
          bVar9 = (bool)((byte)(uVar23 >> 6) & 1);
          bVar10 = (bool)((byte)(uVar23 >> 7) & 1);
          bVar11 = (byte)((ulong)uVar22 >> 8);
          bVar12 = (bool)(bVar11 >> 1 & 1);
          bVar13 = (bool)(bVar11 >> 2 & 1);
          bVar14 = (bool)(bVar11 >> 3 & 1);
          bVar15 = (bool)(bVar11 >> 4 & 1);
          bVar16 = (bool)(bVar11 >> 5 & 1);
          bVar17 = (bool)(bVar11 >> 6 & 1);
          *(ulong *)*local_bf0 =
               CONCAT44((uint)bVar4 * auVar26._4_4_ | (uint)!bVar4 * iStack_3fc,
                        (uint)bVar3 * auVar26._0_4_ | (uint)!bVar3 * local_400);
          *(ulong *)(*local_bf0 + 8) =
               CONCAT44((uint)bVar6 * auVar26._12_4_ | (uint)!bVar6 * iStack_cf4,
                        (uint)bVar5 * auVar26._8_4_ | (uint)!bVar5 * iStack_3f8);
          *(ulong *)(*local_bf0 + 0x10) =
               CONCAT44((uint)bVar8 * auVar26._20_4_ | (uint)!bVar8 * iStack_cec,
                        (uint)bVar7 * auVar26._16_4_ | (uint)!bVar7 * iStack_cf0);
          *(ulong *)(*local_bf0 + 0x18) =
               CONCAT44((uint)bVar10 * auVar26._28_4_ | (uint)!bVar10 * iStack_ce4,
                        (uint)bVar9 * auVar26._24_4_ | (uint)!bVar9 * iStack_ce8);
          *(ulong *)(*local_bf0 + 0x20) =
               CONCAT44((uint)bVar12 * auVar26._36_4_ | (uint)!bVar12 * iStack_cdc,
                        (uint)(bVar11 & 1) * auVar26._32_4_ | (uint)!(bool)(bVar11 & 1) * iStack_ce0
                       );
          *(ulong *)(*local_bf0 + 0x28) =
               CONCAT44((uint)bVar14 * auVar26._44_4_ | (uint)!bVar14 * iStack_cd4,
                        (uint)bVar13 * auVar26._40_4_ | (uint)!bVar13 * iStack_cd8);
          *(ulong *)(*local_bf0 + 0x30) =
               CONCAT44((uint)bVar16 * auVar26._52_4_ | (uint)!bVar16 * iStack_ccc,
                        (uint)bVar15 * auVar26._48_4_ | (uint)!bVar15 * iStack_cd0);
          *(ulong *)(*local_bf0 + 0x38) =
               CONCAT44((uint)(bVar11 >> 7) * auVar26._60_4_ |
                        (uint)!(bool)(bVar11 >> 7) * iStack_cc4,
                        (uint)bVar17 * auVar26._56_4_ | (uint)!bVar17 * iStack_cc8);
          local_bf0 = local_bf0 + 1;
        }
        uVar2 = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        auVar18 = vinsertps_avx(ZEXT416(uVar2),ZEXT416(uVar2),0x10);
        auVar18 = vinsertps_avx(auVar18,ZEXT416(uVar2),0x20);
        auVar18 = vinsertps_avx(auVar18,ZEXT416(uVar2),0x30);
        auVar19 = vinsertps_avx(ZEXT416(uVar2),ZEXT416(uVar2),0x10);
        auVar19 = vinsertps_avx(auVar19,ZEXT416(uVar2),0x20);
        auVar19 = vinsertps_avx(auVar19,ZEXT416(uVar2),0x30);
        for (; local_c3c + 7 < local_a74; local_c3c = local_c3c + 8) {
          auVar20 = vmaxps_avx(ZEXT1632(ZEXT816(0)),*(undefined1 (*) [32])*local_bf0);
          auVar21 = vminps_avx(ZEXT1632(ZEXT816(0)),*(undefined1 (*) [32])*local_bf0);
          local_300 = auVar19._0_4_;
          fStack_2fc = auVar19._4_4_;
          fStack_2f8 = auVar19._8_4_;
          fStack_2f4 = auVar19._12_4_;
          fStack_2f0 = auVar18._0_4_;
          fStack_2ec = auVar18._4_4_;
          fStack_2e8 = auVar18._8_4_;
          fStack_2e4 = auVar18._12_4_;
          local_320 = auVar21._0_4_;
          fStack_31c = auVar21._4_4_;
          fStack_318 = auVar21._8_4_;
          fStack_314 = auVar21._12_4_;
          fStack_310 = auVar21._16_4_;
          fStack_30c = auVar21._20_4_;
          fStack_308 = auVar21._24_4_;
          local_340 = auVar20._0_4_;
          fStack_33c = auVar20._4_4_;
          fStack_338 = auVar20._8_4_;
          fStack_334 = auVar20._12_4_;
          fStack_330 = auVar20._16_4_;
          fStack_32c = auVar20._20_4_;
          fStack_328 = auVar20._24_4_;
          fStack_324 = auVar20._28_4_;
          local_d80 = CONCAT44(fStack_33c + fStack_2fc * fStack_31c,
                               local_340 + local_300 * local_320);
          uStackY_d78 = CONCAT44(fStack_334 + fStack_2f4 * fStack_314,
                                 fStack_338 + fStack_2f8 * fStack_318);
          uStackY_d70 = CONCAT44(fStack_32c + fStack_2ec * fStack_30c,
                                 fStack_330 + fStack_2f0 * fStack_310);
          uStackY_d68 = CONCAT44(fStack_324 + fStack_2e4,fStack_328 + fStack_2e8 * fStack_308);
          *(undefined8 *)*local_bf0 = local_d80;
          *(undefined8 *)(*local_bf0 + 8) = uStackY_d78;
          *(undefined8 *)(*local_bf0 + 0x10) = uStackY_d70;
          *(undefined8 *)(*local_bf0 + 0x18) = uStackY_d68;
          local_bf0 = (undefined1 (*) [64])(*local_bf0 + 0x20);
        }
        fVar1 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        for (; local_c3c + 3 < local_a74; local_c3c = local_c3c + 4) {
          auVar18 = vmaxps_avx(ZEXT816(0),*(undefined1 (*) [16])*local_bf0);
          auVar19 = vminps_avx(ZEXT816(0),*(undefined1 (*) [16])*local_bf0);
          local_280 = auVar19._0_4_;
          fStack_27c = auVar19._4_4_;
          fStack_278 = auVar19._8_4_;
          fStack_274 = auVar19._12_4_;
          local_290 = auVar18._0_4_;
          fStack_28c = auVar18._4_4_;
          fStack_288 = auVar18._8_4_;
          fStack_284 = auVar18._12_4_;
          local_df0 = CONCAT44(fStack_28c + fVar1 * fStack_27c,local_290 + fVar1 * local_280);
          uStackY_de8 = CONCAT44(fStack_284 + fVar1 * fStack_274,fStack_288 + fVar1 * fStack_278);
          *(undefined8 *)*local_bf0 = local_df0;
          *(undefined8 *)(*local_bf0 + 8) = uStackY_de8;
          local_bf0 = (undefined1 (*) [64])(*local_bf0 + 0x10);
        }
        for (; local_c3c < local_a74; local_c3c = local_c3c + 1) {
          if (*(float *)*local_bf0 < 0.0) {
            *(float *)*local_bf0 =
                 *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) * *(float *)*local_bf0
            ;
          }
          local_bf0 = (undefined1 (*) [64])(*local_bf0 + 4);
        }
      }
    }
    else {
      local_a50 = in_RSI;
      for (local_a78 = 0; local_a78 < local_a6c; local_a78 = local_a78 + 1) {
        local_a08 = &local_ac8;
        local_234 = *(int *)((long)local_a50 + 0x2c);
        local_238 = (int)local_a50[6];
        local_23c = *(undefined4 *)((long)local_a50 + 0x34);
        local_248 = (undefined1 (*) [64])
                    (*local_a50 + local_a50[8] * (long)local_a78 * local_a50[2]);
        local_250 = local_a50[2];
        local_254 = (undefined4)local_a50[3];
        local_260 = local_a50[4];
        local_230 = &local_ac8;
        local_1d8 = (long)local_234 * (long)local_238 * local_250;
        local_9f8 = &local_ac8;
        local_9e0 = &local_ac8;
        local_1dc = 0x10;
        local_a14 = local_a78;
        local_a15 = 1;
        local_ac8 = 0;
        local_ab8 = 0;
        local_ab0 = 0;
        local_aa0 = 0;
        local_a9c = 0;
        local_a98 = 0;
        local_a94 = 0;
        local_a90 = 0;
        local_a88 = 0;
        local_ac0 = 0;
        local_980 = 0;
        uStack_978 = 0;
        uStack_970 = 0;
        uStack_968 = 0;
        uStack_960 = 0;
        uStack_958 = 0;
        uStack_950 = 0;
        uStack_948 = 0;
        local_b40 = 0;
        uStack_b38 = 0;
        uStack_b30 = 0;
        uStack_b28 = 0;
        uStack_b20 = 0;
        uStack_b18 = 0;
        uStack_b10 = 0;
        uStack_b08 = 0;
        local_a80 = local_248;
        for (local_ad8 = 0; local_ad8 + 0xf < local_a74; local_ad8 = local_ad8 + 0x10) {
          local_908 = local_a80;
          local_b80 = *(undefined8 *)*local_a80;
          uStack_b78 = *(undefined8 *)(*local_a80 + 8);
          uStack_b70 = *(undefined8 *)(*local_a80 + 0x10);
          uStack_b68 = *(undefined8 *)(*local_a80 + 0x18);
          uStack_b60 = *(undefined8 *)(*local_a80 + 0x20);
          uStack_b58 = *(undefined8 *)(*local_a80 + 0x28);
          uStack_b50 = *(undefined8 *)(*local_a80 + 0x30);
          uStack_b48 = *(undefined8 *)(*local_a80 + 0x38);
          local_808 = local_a80;
          local_7c0 = 0;
          uStack_7b8 = 0;
          uStack_7b0 = 0;
          uStack_7a8 = 0;
          uStack_7a0 = 0;
          uStack_798 = 0;
          uStack_790 = 0;
          uStack_788 = 0;
          local_880 = vmaxps_avx512f(ZEXT1664(ZEXT816(0)),*local_a80);
          *(undefined8 *)*local_a80 = local_880._0_8_;
          *(undefined8 *)(*local_a80 + 8) = local_880._8_8_;
          *(undefined8 *)(*local_a80 + 0x10) = local_880._16_8_;
          *(undefined8 *)(*local_a80 + 0x18) = local_880._24_8_;
          *(undefined8 *)(*local_a80 + 0x20) = local_880._32_8_;
          *(undefined8 *)(*local_a80 + 0x28) = local_880._40_8_;
          *(undefined8 *)(*local_a80 + 0x30) = local_880._48_8_;
          *(undefined8 *)(*local_a80 + 0x38) = local_880._56_8_;
          local_a80 = local_a80 + 1;
          local_800 = local_b80;
          uStack_7f8 = uStack_b78;
          uStack_7f0 = uStack_b70;
          uStack_7e8 = uStack_b68;
          uStack_7e0 = uStack_b60;
          uStack_7d8 = uStack_b58;
          uStack_7d0 = uStack_b50;
          uStack_7c8 = uStack_b48;
        }
        local_740 = 0;
        uStack_738 = 0;
        uStack_730 = 0;
        uStack_728 = 0;
        local_ba0 = 0;
        uStack_b98 = 0;
        uStack_b90 = 0;
        uStack_b88 = 0;
        for (; local_ad8 + 7 < local_a74; local_ad8 = local_ad8 + 8) {
          local_708 = local_a80;
          local_bc0 = *(undefined8 *)*local_a80;
          uStack_bb8 = *(undefined8 *)(*local_a80 + 8);
          uStack_bb0 = *(undefined8 *)(*local_a80 + 0x10);
          uStack_ba8 = *(undefined8 *)(*local_a80 + 0x18);
          local_688 = local_a80;
          local_620 = 0;
          uStack_618 = 0;
          uStack_610 = 0;
          uStack_608 = 0;
          local_6c0 = vmaxps_avx(ZEXT1632(ZEXT816(0)),*(undefined1 (*) [32])*local_a80);
          *(undefined8 *)*local_a80 = local_6c0._0_8_;
          *(undefined8 *)(*local_a80 + 8) = local_6c0._8_8_;
          *(undefined8 *)(*local_a80 + 0x10) = local_6c0._16_8_;
          *(undefined8 *)(*local_a80 + 0x18) = local_6c0._24_8_;
          local_a80 = (undefined1 (*) [64])(*local_a80 + 0x20);
          local_640 = local_bc0;
          uStack_638 = uStack_bb8;
          uStack_630 = uStack_bb0;
          uStack_628 = uStack_ba8;
        }
        local_5e0 = (undefined1  [16])0x0;
        local_bd0 = 0;
        uStack_bc8 = 0;
        for (; local_198 = local_9e0, local_aa8 = local_260, local_ad8 + 3 < local_a74;
            local_ad8 = local_ad8 + 4) {
          local_5c8 = local_a80;
          local_be0 = *(undefined8 *)*local_a80;
          uStack_bd8 = *(undefined8 *)(*local_a80 + 8);
          local_588 = local_a80;
          local_550 = 0;
          uStack_548 = 0;
          local_5a0 = vmaxps_avx(ZEXT816(0),*(undefined1 (*) [16])*local_a80);
          *(undefined8 *)*local_a80 = local_5a0._0_8_;
          *(undefined8 *)(*local_a80 + 8) = local_5a0._8_8_;
          local_a80 = (undefined1 (*) [64])(*local_a80 + 0x10);
          local_560 = local_be0;
          uStack_558 = uStack_bd8;
        }
        for (; local_ad8 < local_a74; local_ad8 = local_ad8 + 1) {
          local_be4 = 0.0;
          pfVar24 = std::max<float>((float *)local_a80,&local_be4);
          *(float *)*local_a80 = *pfVar24;
          local_a80 = (undefined1 (*) [64])(*local_a80 + 4);
        }
      }
    }
    local_a3c = 0;
  }
  return local_a3c;
}

Assistant:

int ReLU_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int elembits = bottom_top_blob.elembits();

    if (elembits == 8)
        return forward_inplace_int8(bottom_top_blob, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    if (slope == 0.f)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            __m512 _zero_avx512 = _mm512_setzero_ps();
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, _mm512_max_ps(_zero_avx512, _p));
                ptr += 16;
            }
#endif // __AVX512F__
            __m256 _zero_avx = _mm256_setzero_ps();
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, _mm256_max_ps(_zero_avx, _p));
                ptr += 8;
            }
#endif // __AVX__
            __m128 _zero = _mm_setzero_ps();
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                _mm_store_ps(ptr, _mm_max_ps(_zero, _p));
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *ptr = std::max(*ptr, 0.f);
                ptr++;
            }
        }
    }
    else
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            __m512 _zero_avx512 = _mm512_setzero_ps();
            __m512 _slope_avx512 = _mm512_set1_ps(slope);
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __mmask16 _is_negative = _mm512_cmp_ps_mask(_p, _zero_avx512, _CMP_LT_OQ);
                _p = _mm512_mask_mul_ps(_p, _is_negative, _p, _slope_avx512);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
            }
#endif // __AVX512F__
            __m256 _zero_avx = _mm256_setzero_ps();
            __m256 _slope_avx = _mm256_set1_ps(slope);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _pos = _mm256_max_ps(_zero_avx, _p);
                __m256 _neg = _mm256_min_ps(_zero_avx, _p);
                _p = _mm256_add_ps(_pos, _mm256_mul_ps(_slope_avx, _neg));
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
#endif // __AVX__
            __m128 _zero = _mm_setzero_ps();
            __m128 _slope = _mm_set1_ps(slope);
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _pos = _mm_max_ps(_zero, _p);
                __m128 _neg = _mm_min_ps(_zero, _p);
                _p = _mm_add_ps(_pos, _mm_mul_ps(_slope, _neg));
                _mm_store_ps(ptr, _p);
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    return 0;
}